

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert_B8G8R8toA8R8G8B8(void *sP,s32 sN,void *dP)

{
  s32 x;
  u32 *dB;
  u8 *sB;
  void *dP_local;
  s32 sN_local;
  void *sP_local;
  
  dB = (u32 *)dP;
  sB = (u8 *)sP;
  for (x = 0; x < sN; x = x + 1) {
    *dB = (uint)sB[2] << 0x10 | 0xff000000 | (uint)sB[1] << 8 | (uint)*sB;
    sB = sB + 3;
    dB = dB + 1;
  }
  return;
}

Assistant:

void CColorConverter::convert_B8G8R8toA8R8G8B8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u32 *dB = (u32 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		*dB = 0xff000000 | (sB[2] << 16) | (sB[1] << 8) | sB[0];

		sB += 3;
		++dB;
	}
}